

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::TiledRgbaInputFile::setFrameBuffer
          (TiledRgbaInputFile *this,Rgba *base,size_t xStride,size_t yStride)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pthread_mutex_t *__mutex;
  pointer pcVar2;
  int iVar3;
  undefined1 in_R10B;
  size_t yst;
  size_t xst;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  FrameBuffer fb;
  Slice local_60;
  
  __mutex = (pthread_mutex_t *)this->_fromYa;
  if (__mutex == (pthread_mutex_t *)0x0) {
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    paVar1 = &__str.field_2;
    pcVar2 = (this->_channelNamePrefix)._M_dataplus._M_p;
    __str._M_dataplus._M_p = (pointer)paVar1;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,pcVar2,pcVar2 + (this->_channelNamePrefix)._M_string_length);
    std::__cxx11::string::append((char *)&__str);
    xst = xStride << 3;
    yst = yStride << 3;
    Slice::Slice(&local_60,HALF,(char *)base,xst,yst,1,1,0.0,(bool)in_R10B,false);
    FrameBuffer::insert(&fb,&__str,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->_channelNamePrefix)._M_dataplus._M_p;
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,pcVar2,pcVar2 + (this->_channelNamePrefix)._M_string_length);
    std::__cxx11::string::append((char *)&__str);
    Slice::Slice(&local_60,HALF,(char *)&base->g,xst,yst,1,1,0.0,(bool)in_R10B,false);
    FrameBuffer::insert(&fb,&__str,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->_channelNamePrefix)._M_dataplus._M_p;
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,pcVar2,pcVar2 + (this->_channelNamePrefix)._M_string_length);
    std::__cxx11::string::append((char *)&__str);
    Slice::Slice(&local_60,HALF,(char *)&base->b,xst,yst,1,1,0.0,(bool)in_R10B,false);
    FrameBuffer::insert(&fb,&__str,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->_channelNamePrefix)._M_dataplus._M_p;
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,pcVar2,pcVar2 + (this->_channelNamePrefix)._M_string_length);
    std::__cxx11::string::append((char *)&__str);
    Slice::Slice(&local_60,HALF,(char *)&base->a,xst,yst,1,1,1.0,(bool)in_R10B,false);
    FrameBuffer::insert(&fb,&__str,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    TiledInputFile::setFrameBuffer(this->_inputFile,&fb);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&fb);
    return;
  }
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    FromYa::setFrameBuffer(this->_fromYa,base,xStride,yStride,&this->_channelNamePrefix);
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void	
TiledRgbaInputFile::setFrameBuffer (Rgba *base, size_t xStride, size_t yStride)
{
    if (_fromYa)
    {
	Lock lock (*_fromYa);
	_fromYa->setFrameBuffer (base, xStride, yStride, _channelNamePrefix);
    }
    else
    {
	size_t xs = xStride * sizeof (Rgba);
	size_t ys = yStride * sizeof (Rgba);

	FrameBuffer fb;

	fb.insert (_channelNamePrefix + "R",
		   Slice (HALF,
			       (char *) &base[0].r,
			       xs, ys,
			       1, 1,	// xSampling, ySampling
			       0.0));	// fillValue

	fb.insert (_channelNamePrefix + "G",
		   Slice (HALF,
			       (char *) &base[0].g,
			       xs, ys,
			       1, 1,	// xSampling, ySampling
			       0.0));	// fillValue

	fb.insert (_channelNamePrefix + "B",
		   Slice (HALF,
			       (char *) &base[0].b,
			       xs, ys,
			       1, 1,	// xSampling, ySampling
			       0.0));	// fillValue

	fb.insert (_channelNamePrefix + "A",
		   Slice (HALF,
			       (char *) &base[0].a,
			       xs, ys,
			       1, 1,	// xSampling, ySampling
			       1.0));	// fillValue

	_inputFile->setFrameBuffer (fb);
    }
}